

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# led_impl.cpp
# Opt level: O2

void __thiscall ui::Led::Toggle(Led *this)

{
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> bStack_238;
  basic_ofstream<char,_std::char_traits<char>_> local_218 [512];
  
  this->brightness_ = (uint)(this->brightness_ == 0);
  std::operator+(&bStack_238,&this->file_path_,"/brightness");
  std::ofstream::ofstream(local_218,(string *)&bStack_238,_S_out);
  std::operator<<(local_218,&this->brightness_);
  std::ofstream::~ofstream(local_218);
  std::__cxx11::string::~string((string *)&bStack_238);
  std::operator+(&bStack_238,&this->file_path_,"/trigger");
  std::ofstream::ofstream(local_218,(string *)&bStack_238,_S_out);
  std::operator<<((ostream *)local_218,"none");
  std::ofstream::~ofstream(local_218);
  std::__cxx11::string::~string((string *)&bStack_238);
  FetchState(this);
  return;
}

Assistant:

void Toggle() {
    brightness_ = !brightness_;
    std::ofstream(file_path_ + "/brightness") << brightness_;
    std::ofstream(file_path_ + "/trigger") << "none";
    FetchState();
  }